

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O0

__cilkrts_worker *
execute_reductions_for_sync(__cilkrts_worker *w,full_frame *ff,__cilkrts_stack_frame *sf_at_sync)

{
  int iVar1;
  full_frame *in_RDX;
  full_frame *in_RSI;
  full_frame *in_RDI;
  __cilkrts_worker *unaff_retaddr;
  int finished_reductions;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  in_RSI->call_stack = (__cilkrts_stack_frame *)0x0;
  if (((uint)in_RDX->full_frame_magic_0 | 1) == 0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                  ,0xf79,"sf_at_sync->flags | CILK_FRAME_STOLEN");
  }
  __cilkrts_put_stack(in_RSI,(__cilkrts_stack_frame *)in_RDX);
  __cilkrts_make_unrunnable_sysdep
            ((__cilkrts_worker *)in_RSI,in_RDX,
             (__cilkrts_stack_frame *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc,(char *)0x112372);
  if (((local_state *)in_RDI->right_sibling)->frame_ff == in_RSI) {
    iVar1 = fast_path_reductions_for_sync((__cilkrts_worker *)in_RDI,in_RSI);
    if (iVar1 == 0) {
      in_RDI = (full_frame *)slow_path_reductions_for_sync(unaff_retaddr,in_RDI);
      verify_current_wkr((__cilkrts_worker *)in_RDI);
    }
    if (((local_state *)in_RDI->right_sibling)->frame_ff == in_RSI) {
      if (in_RSI->call_stack == (__cilkrts_stack_frame *)0x0) {
        in_RSI->call_stack = (__cilkrts_stack_frame *)in_RDX;
        *(uint *)&in_RDX->full_frame_magic_0 = (uint)in_RDX->full_frame_magic_0 | 0x8000;
        ((local_state *)in_RDI->right_sibling)->fiber_to_free = in_RSI->fiber_self;
        in_RSI->fiber_self = (cilk_fiber *)0x0;
        return (__cilkrts_worker *)in_RDI;
      }
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                    ,0xf92,"ff->call_stack == NULL");
    }
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                  ,0xf91,"w->l->frame_ff == ff");
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                ,0xf7e,"w->l->frame_ff == ff");
}

Assistant:

static __cilkrts_worker*
execute_reductions_for_sync(__cilkrts_worker *w,
                            full_frame *ff,
                            __cilkrts_stack_frame *sf_at_sync)
{
    int finished_reductions;
    // Step B1 from reducer protocol above:
    // Restore runtime invariants.
    //
    // The following code for this step is almost equivalent to
    // the following sequence:
    //   1. disown(w, ff, sf_at_sync, "sync") (which itself
    //        calls make_unrunnable(w, ff, sf_at_sync))
    //   2. make_runnable(w, ff, sf_at_sync).
    //
    // The "disown" will mark the frame "sf_at_sync"
    // as stolen and suspended, and save its place on the stack,
    // so it can be resumed after the sync. 
    //
    // The difference is, that we don't want the disown to 
    // break the following connections yet, since we are
    // about to immediately make sf/ff runnable again anyway.
    //   sf_at_sync->worker == w
    //   w->l->frame_ff == ff.
    //
    // These connections are needed for parallel reductions, since
    // we will use sf / ff as the stack frame / full frame for
    // executing any potential reductions.
    //
    // TBD: Can we refactor the disown / make_unrunnable code
    // to avoid the code duplication here?

    ff->call_stack = NULL;

    // Normally, "make_unrunnable" would add CILK_FRAME_STOLEN and
    // CILK_FRAME_SUSPENDED to sf_at_sync->flags and save the state of
    // the stack so that a worker can resume the frame in the correct
    // place.
    //
    // But on this path, CILK_FRAME_STOLEN should already be set.
    // Also, we technically don't want to suspend the frame until
    // the reduction finishes.
    // We do, however, need to save the stack before
    // we start any reductions, since the reductions might push more
    // data onto the stack.
    CILK_ASSERT(sf_at_sync->flags | CILK_FRAME_STOLEN);

    __cilkrts_put_stack(ff, sf_at_sync);
    __cilkrts_make_unrunnable_sysdep(w, ff, sf_at_sync, 1,
                                     "execute_reductions_for_sync");
    CILK_ASSERT(w->l->frame_ff == ff);

    // Step B2: Execute reductions on user stack.
    // Check if we have any "real" reductions to do.
    finished_reductions = fast_path_reductions_for_sync(w, ff);
    
    if (!finished_reductions) {
        // Still have some real reductions to execute.
        // Run them here.

        // This method may acquire/release the lock on ff.
        w = slow_path_reductions_for_sync(w, ff);

        // The previous call may return on a different worker.
        // than what we started on.
        verify_current_wkr(w);
    }

#if REDPAR_DEBUG >= 0
    CILK_ASSERT(w->l->frame_ff == ff);
    CILK_ASSERT(ff->call_stack == NULL);
#endif

    // Now we suspend the frame ff (since we've
    // finished the reductions).  Roughly, we've split apart the 
    // "make_unrunnable" call here --- we've already saved the
    // stack info earlier before the reductions execute.
    // All that remains is to restore the call stack back into the
    // full frame, and mark the frame as suspended.
    ff->call_stack = sf_at_sync;
    sf_at_sync->flags |= CILK_FRAME_SUSPENDED;

    // At a nontrivial sync, we should always free the current fiber,
    // because it can not be leftmost.
    w->l->fiber_to_free = ff->fiber_self;
    ff->fiber_self = NULL;
    return w;
}